

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall
IR::MultiBranchInstr::ReplaceTarget
          (MultiBranchInstr *this,LabelInstr *oldLabelInstr,LabelInstr *newLabelInstr)

{
  code *pcVar1;
  anon_class_32_4_a8a98ec6_for_fn fn;
  bool bVar2;
  undefined4 *puVar3;
  byte local_21;
  LabelInstr *pLStack_20;
  bool remapped;
  LabelInstr *newLabelInstr_local;
  LabelInstr *oldLabelInstr_local;
  MultiBranchInstr *this_local;
  
  pLStack_20 = newLabelInstr;
  newLabelInstr_local = oldLabelInstr;
  oldLabelInstr_local = (LabelInstr *)this;
  bVar2 = BranchInstr::IsMultiBranch(&this->super_BranchInstr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x6ee,"(this->IsMultiBranch())","this->IsMultiBranch()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_21 = 0;
  fn.oldLabelInstr = newLabelInstr_local;
  fn.remapped = (bool *)&local_21;
  fn.this = this;
  fn.newLabelInstr = pLStack_20;
  UpdateMultiBrLabels<IR::MultiBranchInstr::ReplaceTarget(IR::LabelInstr*,IR::LabelInstr*)::__0>
            (this,fn);
  return (bool)(local_21 & 1);
}

Assistant:

bool
MultiBranchInstr::ReplaceTarget(IR::LabelInstr * oldLabelInstr, IR::LabelInstr * newLabelInstr)
{
    Assert(this->IsMultiBranch());
    bool remapped = false;
    this->UpdateMultiBrLabels([=, &remapped](IR::LabelInstr * targetLabel) -> IR::LabelInstr *
    {
        if (targetLabel == oldLabelInstr)
        {
            this->ChangeLabelRef(targetLabel, newLabelInstr);
            remapped = true;
            return newLabelInstr;
        }
        return targetLabel;
    });
    return remapped;
}